

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_setParametersUsingCCtxParams(ZSTD_CCtx *cctx,ZSTD_CCtx_params *params)

{
  void *in_RSI;
  long in_RDI;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0xe18) == 0) {
    if (*(long *)(in_RDI + 0xe70) == 0) {
      memcpy((void *)(in_RDI + 0x10),in_RSI,0xd8);
      local_8 = 0;
    }
    else {
      local_8 = 0xffffffffffffffc4;
    }
  }
  else {
    local_8 = 0xffffffffffffffc4;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_setParametersUsingCCtxParams(
        ZSTD_CCtx* cctx, const ZSTD_CCtx_params* params)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParametersUsingCCtxParams");
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "The context is in the wrong stage!");
    RETURN_ERROR_IF(cctx->cdict, stage_wrong,
                    "Can't override parameters with cdict attached (some must "
                    "be inherited from the cdict).");

    cctx->requestedParams = *params;
    return 0;
}